

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_cookie.cpp
# Opt level: O3

void __thiscall cppcms::http::cookie::~cookie(cookie *this)

{
  pointer pcVar1;
  _data *p_Var2;
  
  pcVar1 = (this->comment_)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->comment_).field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->domain_)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->domain_).field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->path_)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->path_).field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->value_)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->value_).field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->name_)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->name_).field_2) {
    operator_delete(pcVar1);
  }
  p_Var2 = (this->d).ptr_;
  if (p_Var2 != (_data *)0x0) {
    operator_delete(p_Var2);
    return;
  }
  return;
}

Assistant:

cookie::~cookie() {}